

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
stringSliceLength(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  ulong uVar1;
  
  uVar1 = (ulong)**(byte **)this;
  if (uVar1 == 0xbf) {
    return *(long *)(*(byte **)this + 1) + 9;
  }
  return uVar1 - 0x3f;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }